

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.h
# Opt level: O3

Relations dg::vr::RelationsAnalyzer::getCommon<unsigned_long,unsigned_long>
                    (VRLocation *location,unsigned_long *lt,Relations known,unsigned_long *rt)

{
  pointer ppVVar1;
  Relations RVar2;
  pointer ppVVar3;
  
  ppVVar3 = (location->predecessors).
            super__Vector_base<dg::vr::VREdge_*,_std::allocator<dg::vr::VREdge_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppVVar1 = (location->predecessors).
            super__Vector_base<dg::vr::VREdge_*,_std::allocator<dg::vr::VREdge_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  while( true ) {
    if (ppVVar3 == ppVVar1) {
      return (Relations)(_WordT)known.bits.super__Base_bitset<1UL>._M_w;
    }
    RVar2 = ValueRelations::_between<unsigned_long>(&(*ppVVar3)->source->relations,*lt,rt);
    known.bits.super__Base_bitset<1UL>._M_w =
         (bitset<12UL>)
         ((ulong)RVar2.bits.super__Base_bitset<1UL>._M_w &
         (ulong)known.bits.super__Base_bitset<1UL>._M_w);
    if (known.bits.super__Base_bitset<1UL>._M_w == (_Base_bitset<1UL>)0x0) break;
    ppVVar3 = ppVVar3 + 1;
  }
  return (Relations)0;
}

Assistant:

static Relations getCommon(const VRLocation &location, const X &lt,
                               Relations known, const Y &rt) {
        for (VREdge *predEdge : location.predecessors) {
            const ValueRelations &predRels = predEdge->source->relations;
            known &= predRels.between(lt, rt);
            if (!known.any())
                return Relations();
        }
        return known;
    }